

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O0

void __thiscall transition_invoke_guard_e_Test::TestBody(transition_invoke_guard_e_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_78;
  Message local_70;
  bool local_64;
  event_type local_63;
  source_type local_62;
  bool local_61;
  undefined1 local_60 [8];
  AssertionResult gtest_ar_1;
  Message local_48 [3];
  bool local_2b;
  e1 local_2a;
  bool local_29;
  undefined1 local_28 [8];
  AssertionResult gtest_ar;
  Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:155:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
  transition;
  transition_invoke_guard_e_Test *this_local;
  
  state_machine::transition::
  make_transition<state_machine::transition::State<(anonymous_namespace)::s1>,state_machine::transition::Event<(anonymous_namespace)::e1>,transition_invoke_guard_e_Test::TestBody()::__0,state_machine::containers::basic::identity<state_machine::transition::detail::empty>const&,state_machine::containers::basic::identity<state_machine::transition::detail::empty>>
            ((undefined1 *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             + 4),&state_machine::placeholder::_);
  local_29 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc:155:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
             ::guard<(anonymous_namespace)::e1>
                       ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:155:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
                         *)((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7),&local_2a);
  local_2b = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_28,"transition.guard(e1{})","true",&local_29,&local_2b);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_28);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_48);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  local_61 = state_machine::transition::
             Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc:155:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
             ::invoke_guard<bool,_0>
                       ((Transition<state_machine::transition::State<(anonymous_namespace)::s1>,_state_machine::transition::Event<(anonymous_namespace)::e1>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oliverlee[P]state_machine_tests_test_transition_cc:155:31),_state_machine::transition::detail::action_pass,_state_machine::transition::State<void>_>
                         *)((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           + 7),&local_62,&local_63);
  local_64 = true;
  testing::internal::EqHelper::Compare<bool,_bool,_nullptr>
            ((EqHelper *)local_60,"transition.invoke_guard(s1{}, e1{})","true",&local_61,&local_64);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/oliverlee[P]state-machine/tests/test_transition.cc"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(&local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST(transition, invoke_guard_e) {
    auto transition = make_transition(
        state<s1>, event<e1>, [](const e1&) { return true; }, _, _);

    EXPECT_EQ(transition.guard(e1{}), true);

    EXPECT_EQ(transition.invoke_guard(s1{}, e1{}), true);
}